

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall ArrayOps::evaluate(ArrayOps *this,SymTab *symTab)

{
  ExprNode *pEVar1;
  bool bVar2;
  int iVar3;
  TypeDescriptor *pTVar4;
  undefined4 extraout_var;
  StringDescriptor *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NumberDescriptor *this_01;
  undefined4 extraout_var_02;
  ArrayDescriptor *this_02;
  pointer __src;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> array;
  _Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_f0;
  string local_d8;
  TypeDescriptor *newElement;
  TypeDescriptor *newElement_1;
  string local_40;
  
  ExprNode::token((Token *)&newElement_1,this->_id);
  std::__cxx11::string::string((string *)&local_40,(string *)&newElement_1);
  pTVar4 = SymTab::getValueFor(symTab,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Token::~Token((Token *)&newElement_1);
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector(&array,&pTVar4->_array);
  std::__cxx11::string::string((string *)&newElement_1,(string *)&this->_op);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &newElement_1,"append");
  std::__cxx11::string::~string((string *)&newElement_1);
  pEVar1 = this->_test;
  if (bVar2) {
    iVar3 = (*pEVar1->_vptr_ExprNode[1])(pEVar1,symTab);
    if (*(int *)(CONCAT44(extraout_var,iVar3) + 0x50) == 0) {
      this_01 = (NumberDescriptor *)operator_new(0x60);
      iVar3 = (*this->_test->_vptr_ExprNode[1])(this->_test,symTab);
      NumberDescriptor::NumberDescriptor(this_01,*(double *)(CONCAT44(extraout_var_02,iVar3) + 8));
      newElement_1 = (TypeDescriptor *)this_01;
      std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::push_back
                (&array,&newElement_1);
    }
    else {
      this_00 = (StringDescriptor *)operator_new(0x78);
      iVar3 = (*this->_test->_vptr_ExprNode[1])(this->_test,symTab);
      std::__cxx11::string::string
                ((string *)&newElement_1,(string *)(CONCAT44(extraout_var_00,iVar3) + 0x10));
      StringDescriptor::StringDescriptor(this_00,(string *)&newElement_1);
      std::__cxx11::string::~string((string *)&newElement_1);
      newElement = (TypeDescriptor *)this_00;
      std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::push_back
                (&array,&newElement);
    }
  }
  else if (pEVar1 == (ExprNode *)0x0) {
    array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  else {
    iVar3 = (*pEVar1->_vptr_ExprNode[1])(pEVar1,symTab);
    __src = array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
            super__Vector_impl_data._M_start + (int)*(double *)(CONCAT44(extraout_var_01,iVar3) + 8)
    ;
    if (__src != array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
      memmove(__src + -1,__src,
              (long)array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__src);
    }
    array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  this_02 = (ArrayDescriptor *)operator_new(0x70);
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector
            ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&local_f0,&array);
  ArrayDescriptor::ArrayDescriptor
            (this_02,(vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&local_f0);
  std::_Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~_Vector_base(&local_f0);
  ExprNode::token((Token *)&newElement_1,this->_id);
  std::__cxx11::string::string((string *)&local_d8,(string *)&newElement_1);
  SymTab::setValueFor(symTab,&local_d8,(TypeDescriptor *)this_02);
  std::__cxx11::string::~string((string *)&local_d8);
  Token::~Token((Token *)&newElement_1);
  std::_Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~_Vector_base
            (&array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>);
  return;
}

Assistant:

void ArrayOps::evaluate(SymTab &symTab) {
    TypeDescriptor *value = symTab.getValueFor(_id->token().getName());
    std::vector<TypeDescriptor*>array = value->getArray();
    if(_op.getName() == "append"){
        if(_test->evaluate(symTab)->type() == TypeDescriptor::NUMBER){
            TypeDescriptor *newElement = new NumberDescriptor(_test->evaluate(symTab)->getNumber());
            array.push_back(newElement);
        }else{
            TypeDescriptor *newElement = new StringDescriptor(_test->evaluate(symTab)->getString());
            array.push_back(newElement);
        }

    }else{ // pop
        if(_test== nullptr) { //pop Last
            array.pop_back();
        }else{
            int index = _test->evaluate(symTab)->getNumber();
            array.erase(array.begin()+ index -1);
        }
    }
    TypeDescriptor *updatedArray = new ArrayDescriptor(array);
    symTab.setValueFor(_id->token().getName(),updatedArray);

}